

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>
          (CodeGenerateVisitor *this,ElseIfStatement *if_stmt)

{
  bool bVar1;
  pointer pSVar2;
  size_t sVar3;
  Function *this_00;
  Instruction *pIVar4;
  CodeGenerateVisitor *in_RDI;
  int end_index;
  int index;
  Guard g_1;
  int jmp_index;
  Instruction instruction;
  ExpVarData_conflict exp_var_data;
  int register_id;
  Guard g;
  int r;
  int jmp_end_index;
  Function *function;
  size_t in_stack_fffffffffffffe68;
  Guard *in_stack_fffffffffffffe70;
  Function *this_01;
  Function *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  Instruction in_stack_fffffffffffffe84;
  function<void_()> *in_stack_fffffffffffffe88;
  function<void_()> *enter;
  Guard *in_stack_fffffffffffffe90;
  Guard *this_02;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Guard local_128;
  function<void_()> local_100 [2];
  uint local_bc;
  undefined4 local_b8;
  uint local_b4;
  ExpVarData local_b0 [2];
  int local_90;
  int local_20;
  undefined4 local_1c;
  Function *local_18;
  
  local_18 = GetCurrentFunction(in_RDI);
  local_1c = 0;
  local_20 = GetNextRegisterId(in_RDI);
  std::function<void()>::
  function<luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>(luna::ElseIfStatement*)::_lambda()_1_,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80),
             (anon_class_1_0_00000001 *)in_stack_fffffffffffffe78);
  local_90 = local_20;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>(luna::ElseIfStatement*)::_lambda()_2_,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80),
             (anon_class_16_2_fd512ddf *)in_stack_fffffffffffffe78);
  Guard::Guard(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (function<void_()> *)
               CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80));
  std::function<void_()>::~function((function<void_()> *)0x21b5b2);
  std::function<void_()>::~function((function<void_()> *)0x21b5bf);
  local_b0[0]._8_4_ =
       GenerateRegisterId((CodeGenerateVisitor *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  ExpVarData::ExpVarData(local_b0,local_b0[0]._8_4_,local_b0[0]._8_4_ + 1);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x21b605);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b0);
  local_bc = (uint)Instruction::AsBxCode
                             ((OpType)in_stack_fffffffffffffe70,
                              (int)(in_stack_fffffffffffffe68 >> 0x20),
                              (int)in_stack_fffffffffffffe68);
  local_b4 = local_bc;
  sVar3 = Function::AddInstruction
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe84,
                     (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_b8 = (undefined4)sVar3;
  enter = local_100;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>(luna::ElseIfStatement*)::_lambda()_3_,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
  this_02 = &local_128;
  std::function<void()>::
  function<luna::CodeGenerateVisitor::IfStatementGenerateCode<luna::ElseIfStatement>(luna::ElseIfStatement*)::_lambda()_4_,void>
            ((function<void_()> *)
             CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80),
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe78);
  Guard::Guard(this_02,enter,
               (function<void_()> *)
               CONCAT44(in_stack_fffffffffffffe84.opcode_,in_stack_fffffffffffffe80));
  std::function<void_()>::~function((function<void_()> *)0x21b6ec);
  std::function<void_()>::~function((function<void_()> *)0x21b6f9);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x21b70a);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  Guard::~Guard(in_stack_fffffffffffffe70);
  local_b4 = (uint)Instruction::AsBxCode
                             ((OpType)in_stack_fffffffffffffe70,
                              (int)(in_stack_fffffffffffffe68 >> 0x20),
                              (int)in_stack_fffffffffffffe68);
  sVar3 = Function::AddInstruction
                    (in_stack_fffffffffffffe78,(Instruction)local_b4,
                     (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_1c = (undefined4)sVar3;
  this_00 = (Function *)Function::OpCodeSize((Function *)0x21b79c);
  this_01 = this_00;
  pIVar4 = Function::GetMutableInstruction(this_00,in_stack_fffffffffffffe68);
  Instruction::RefillsBx(pIVar4,(short)this_00 - (short)local_b8);
  Guard::~Guard((Guard *)this_01);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x21b7fc);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x21b816);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  }
  sVar3 = Function::OpCodeSize((Function *)0x21b8e0);
  pIVar4 = Function::GetMutableInstruction(this_01,(size_t)pIVar4);
  Instruction::RefillsBx(pIVar4,(short)sVar3 - (short)local_1c);
  return;
}

Assistant:

void CodeGenerateVisitor::IfStatementGenerateCode(StatementType *if_stmt)
    {
        auto function = GetCurrentFunction();
        int jmp_end_index = 0;
        {
            REGISTER_GENERATOR_GUARD();
            auto register_id = GenerateRegisterId();
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            if_stmt->exp_->Accept(this, &exp_var_data);

            auto instruction = Instruction::AsBxCode(OpType_JmpFalse, register_id, 0);
            int jmp_index = function->AddInstruction(instruction, if_stmt->line_);

            {
                // True branch block generate code
                CODE_GENERATE_GUARD(EnterBlock, LeaveBlock);
                if_stmt->true_branch_->Accept(this, nullptr);
            }

            // Jmp to the end of if-elseif-else statement after excute block
            instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
            jmp_end_index = function->AddInstruction(instruction, if_stmt->block_end_line_);

            // Refill OpType_JmpFalse instruction
            int index = function->OpCodeSize();
            function->GetMutableInstruction(jmp_index)->RefillsBx(index - jmp_index);
        }

        if (if_stmt->false_branch_)
            if_stmt->false_branch_->Accept(this, nullptr);

        // Refill OpType_Jmp instruction
        int end_index = function->OpCodeSize();
        function->GetMutableInstruction(jmp_end_index)->RefillsBx(end_index - jmp_end_index);
    }